

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O0

void Ndr_ObjWriteRange(Ndr_Data_t *p,int Obj,FILE *pFile,int fSkipBin)

{
  int iVar1;
  uint *puStack_30;
  int nArray;
  int *pArray;
  FILE *pFStack_20;
  int fSkipBin_local;
  FILE *pFile_local;
  Ndr_Data_t *pNStack_10;
  int Obj_local;
  Ndr_Data_t *p_local;
  
  pArray._4_4_ = fSkipBin;
  pFStack_20 = (FILE *)pFile;
  pFile_local._4_4_ = Obj;
  pNStack_10 = p;
  iVar1 = Ndr_ObjReadArray(p,Obj,8,(int **)&stack0xffffffffffffffd0);
  if (((iVar1 != 0) && (iVar1 != 1)) || (pArray._4_4_ == 0)) {
    if ((iVar1 == 3) && (pArray._4_4_ != 0)) {
      fprintf(pFStack_20,"signed ");
    }
    else if (iVar1 == 1) {
      if (pArray._4_4_ == 0) {
        fprintf(pFStack_20,"[%d]",(ulong)*puStack_30);
      }
      else {
        fprintf(pFStack_20,"[%d:%d]",(ulong)*puStack_30,(ulong)*puStack_30);
      }
    }
    else if (iVar1 == 0) {
      if (pArray._4_4_ == 0) {
        fprintf(pFStack_20,"[%d]",0);
      }
      else {
        fprintf(pFStack_20,"[%d:%d]",0);
      }
    }
    else {
      fprintf(pFStack_20,"[%d:%d]",(ulong)*puStack_30,(ulong)puStack_30[1]);
    }
  }
  return;
}

Assistant:

static inline void Ndr_ObjWriteRange( Ndr_Data_t * p, int Obj, FILE * pFile, int fSkipBin )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    if ( (nArray == 0 || nArray == 1) && fSkipBin )
        return;
    if ( nArray == 3 && fSkipBin )
        fprintf( pFile, "signed " ); 
    else if ( nArray == 1 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", pArray[0], pArray[0] );
        else
            fprintf( pFile, "[%d]", pArray[0] );
    }
    else if ( nArray == 0 )
    {
        if ( fSkipBin )
            fprintf( pFile, "[%d:%d]", 0, 0 );
        else
            fprintf( pFile, "[%d]", 0 );
    }
    else
        fprintf( pFile, "[%d:%d]", pArray[0], pArray[1] );
}